

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw_pal.cpp
# Opt level: O1

void __thiscall
swrenderer::DrawColumnPalCommand::Execute(DrawColumnPalCommand *this,DrawerThread *thread)

{
  int iVar1;
  int iVar2;
  uint8_t *puVar3;
  uint8_t *puVar4;
  ulong uVar5;
  ulong uVar6;
  int core_skip;
  int iVar7;
  uint8_t *puVar8;
  int pass_skip;
  uint uVar9;
  int iVar10;
  
  iVar7 = (this->super_PalColumnCommand).super_DrawerCommand._dest_y;
  iVar1 = *(int *)&(this->super_PalColumnCommand).super_DrawerCommand.field_0xc;
  iVar10 = thread->pass_end_y - iVar7;
  if (iVar10 < 1) {
    iVar10 = 0;
  }
  if (iVar1 < iVar10) {
    iVar10 = iVar1;
  }
  uVar9 = thread->pass_start_y - iVar7;
  if ((int)uVar9 < 1) {
    uVar9 = 0;
  }
  iVar1 = thread->num_cores;
  iVar7 = (iVar1 - (int)((iVar7 + uVar9) - thread->core) % iVar1) % iVar1;
  uVar5 = (long)(int)((~uVar9 + iVar1 + iVar10) - iVar7) / (long)iVar1;
  uVar6 = uVar5 & 0xffffffff;
  if (0 < (int)uVar5) {
    iVar10 = (this->super_PalColumnCommand)._pitch;
    iVar2 = (this->super_PalColumnCommand)._iscale;
    iVar7 = iVar7 + uVar9;
    puVar8 = (this->super_PalColumnCommand)._dest + iVar10 * iVar7;
    iVar7 = iVar7 * iVar2 + (this->super_PalColumnCommand)._texturefrac;
    puVar3 = (this->super_PalColumnCommand)._colormap;
    puVar4 = (this->super_PalColumnCommand)._source;
    do {
      *puVar8 = puVar3[puVar4[iVar7 >> 0x10]];
      puVar8 = puVar8 + iVar10 * iVar1;
      iVar7 = iVar7 + iVar2 * iVar1;
      uVar9 = (int)uVar6 - 1;
      uVar6 = (ulong)uVar9;
    } while (uVar9 != 0);
  }
  return;
}

Assistant:

void DrawColumnPalCommand::Execute(DrawerThread *thread)
	{
		int count;
		uint8_t *dest;
		fixed_t frac;
		fixed_t fracstep;

		count = _count;

		// Framebuffer destination address.
		dest = _dest;

		// Determine scaling,
		//	which is the only mapping to be done.
		fracstep = _iscale;
		frac = _texturefrac;

		count = thread->count_for_thread(_dest_y, count);
		if (count <= 0)
			return;

		int pitch = _pitch;
		dest = thread->dest_for_thread(_dest_y, pitch, dest);
		frac += fracstep * thread->skipped_by_thread(_dest_y);
		fracstep *= thread->num_cores;
		pitch *= thread->num_cores;

		// [RH] Get local copies of these variables so that the compiler
		//		has a better chance of optimizing this well.
		const uint8_t *colormap = _colormap;
		const uint8_t *source = _source;

		// Inner loop that does the actual texture mapping,
		//	e.g. a DDA-lile scaling.
		// This is as fast as it gets.
		do
		{
			// Re-map color indices from wall texture column
			//	using a lighting/special effects LUT.
			*dest = colormap[source[frac >> FRACBITS]];

			dest += pitch;
			frac += fracstep;

		} while (--count);
	}